

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::XYZVisitor::XYZVisitor(XYZVisitor *this,SimInfo *info,string *script)

{
  SelectionEvaluator *this_00;
  long lVar1;
  SelectionSet local_48;
  
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__XYZVisitor_002bb298;
  this->info = (SimInfo *)0x0;
  SelectionManager::SelectionManager(&this->seleMan,info);
  this_00 = &this->evaluator;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  (this->frame).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frame).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frame).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->doPositions_ = true;
  this->doVelocities_ = false;
  this->doForces_ = false;
  this->doVectors_ = false;
  this->doCharges_ = false;
  this->doElectricFields_ = false;
  this->doGlobalIDs_ = false;
  this->info = info;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseVisitor).visitorName,0,
             (char *)(this->super_BaseVisitor).visitorName._M_string_length,0x26417b);
  SelectionEvaluator::loadScriptString(this_00,script);
  if ((this->evaluator).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_48,this_00);
    lVar1 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar1),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_48.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar1));
      lVar1 = lVar1 + 0x28;
    } while (lVar1 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_48.bitsets_);
  }
  return;
}

Assistant:

XYZVisitor::XYZVisitor(SimInfo* info, const std::string& script) :
      BaseVisitor(), seleMan(info), evaluator(info), doPositions_(true),
      doVelocities_(false), doForces_(false), doVectors_(false),
      doCharges_(false), doElectricFields_(false), doGlobalIDs_(false) {
    this->info  = info;
    visitorName = "XYZVisitor";

    evaluator.loadScriptString(script);

    if (!evaluator.isDynamic()) {
      seleMan.setSelectionSet(evaluator.evaluate());
    }
  }